

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O3

void ParseBoardInformation(EeePModuleInfo_t *info)

{
  byte bVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  puVar8 = info->Handles[0].b + (ulong)info->ContainedHndls * 2;
  if (info->Manufacturer != '\0') {
    cVar5 = info->Manufacturer + 0xff;
    puVar6 = puVar8;
    if (cVar5 != '\0') {
      do {
        puVar7 = puVar6;
        sVar2 = strlen((char *)puVar7);
        puVar6 = puVar7 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_00103106;
    }
    printf("      Manufacturer: %s\n",puVar6);
  }
LAB_00103106:
  if (info->Product != '\0') {
    cVar5 = info->Product + 0xff;
    puVar6 = puVar8;
    if (cVar5 != '\0') {
      do {
        puVar7 = puVar6;
        sVar2 = strlen((char *)puVar7);
        puVar6 = puVar7 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_00103144;
    }
    printf("      Product: %s\n",puVar6);
  }
LAB_00103144:
  if (info->Version != '\0') {
    cVar5 = info->Version + 0xff;
    puVar6 = puVar8;
    if (cVar5 != '\0') {
      do {
        puVar7 = puVar6;
        sVar2 = strlen((char *)puVar7);
        puVar6 = puVar7 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_00103182;
    }
    printf("      Version: %s\n",puVar6);
  }
LAB_00103182:
  if (info->SerialNumber != '\0') {
    cVar5 = info->SerialNumber + 0xff;
    puVar6 = puVar8;
    if (cVar5 != '\0') {
      do {
        puVar7 = puVar6;
        sVar2 = strlen((char *)puVar7);
        puVar6 = puVar7 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_001031c0;
    }
    printf("      Serial Number: %s\n",puVar6);
  }
LAB_001031c0:
  if (info->AssetTag != '\0') {
    cVar5 = info->AssetTag + 0xff;
    puVar6 = puVar8;
    if (cVar5 != '\0') {
      do {
        puVar7 = puVar6;
        sVar2 = strlen((char *)puVar7);
        puVar6 = puVar7 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar7 == (uint8_t *)0x0) goto LAB_001031fe;
    }
    printf("      Asset Tag: %s\n",puVar6);
  }
LAB_001031fe:
  if (info->FeatureFlag != '\0') {
    printf("      Features: ");
    bVar1 = info->FeatureFlag;
    if ((bVar1 & 1) != 0) {
      printf("Motherboard ");
      bVar1 = info->FeatureFlag;
    }
    if ((bVar1 & 2) != 0) {
      printf("ReqDaughterBoard ");
      bVar1 = info->FeatureFlag;
    }
    if ((bVar1 & 4) != 0) {
      printf("Removable ");
      bVar1 = info->FeatureFlag;
    }
    if ((bVar1 & 8) != 0) {
      printf("Replaceable ");
      bVar1 = info->FeatureFlag;
    }
    if ((bVar1 & 0x10) != 0) {
      printf("HotSwapCapable ");
    }
    putchar(10);
  }
  if (info->Location != '\0') {
    cVar5 = info->Location + 0xff;
    if (cVar5 != '\0') {
      do {
        puVar6 = puVar8;
        sVar2 = strlen((char *)puVar6);
        puVar8 = puVar6 + sVar2 + 1;
        cVar5 = cVar5 + -1;
      } while (cVar5 != '\0');
      if (puVar6 == (uint8_t *)0x0) goto LAB_001032c3;
    }
    printf("      Location: %s\n",puVar8);
  }
LAB_001032c3:
  lVar3 = 8;
  pcVar4 = "";
  do {
    if (*(byte *)((long)&SmbiosBlockTexts[7].text + lVar3) == info->BoardType) {
      pcVar4 = *(char **)(&BoardTypeTexts[0].code + lVar3);
      break;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xd8);
  printf("      Board Type: %d (%s)\n",(ulong)info->BoardType,pcVar4);
  return;
}

Assistant:

void ParseBoardInformation(EeePModuleInfo_t *info)
{
    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        printf("      Manufacturer: %s\n", str);
    }
    if (str = GetSmbiosString(info->Product, strstart)) {
        printf("      Product: %s\n", str);
    }
    if (str = GetSmbiosString(info->Version, strstart)) {
        printf("      Version: %s\n", str);
    }
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        printf("      Serial Number: %s\n", str);
    }
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        printf("      Asset Tag: %s\n", str);
    }
    if (info->FeatureFlag) {
        printf("      Features: ");
        if (info->FeatureFlag & SMBIOS_IS_Motherboard) {
            printf("Motherboard ");
        }
        if (info->FeatureFlag & SMBIOS_REQ_DAUGHTER) {
            printf("ReqDaughterBoard ");
        }
        if (info->FeatureFlag & SMBIOS_REMOVABLE) {
            printf("Removable ");
        }
        if (info->FeatureFlag & SMBIOS_REPLACEABLE) {
            printf("Replaceable ");
        }
        if (info->FeatureFlag & SMBIOS_HOT_SWAP_CAP) {
            printf("HotSwapCapable ");
        }
        printf("\n");
    }
    if (str = GetSmbiosString(info->Location, strstart)) {
        printf("      Location: %s\n", str);
    }
    printf("      Board Type: %d (%s)\n", 
        info->BoardType, FindBoardTypeText(info->BoardType));
}